

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

string * __thiscall
soul::AST::Scope::makeUniqueName(string *__return_storage_ptr__,Scope *this,string *root)

{
  anon_class_8_1_8991fb9c *in_RCX;
  Scope *local_28;
  string *local_20;
  string *root_local;
  Scope *this_local;
  
  local_28 = this;
  local_20 = root;
  root_local = (string *)this;
  this_local = (Scope *)__return_storage_ptr__;
  addSuffixToMakeUnique<soul::AST::Scope::makeUniqueName(std::__cxx11::string_const&)const::_lambda(std::__cxx11::string_const&)_1_>
            (__return_storage_ptr__,(soul *)root,(string *)&local_28,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

std::string makeUniqueName (const std::string& root) const
        {
            return addSuffixToMakeUnique (root,
                                          [this] (const std::string& name)
                                          {
                                              for (auto& f : getFunctions())
                                                  if (f->name == name)
                                                      return true;

                                              for (auto& s : getStructDeclarations())
                                                  if (s->name == name)
                                                      return true;

                                              for (auto& u : getUsingDeclarations())
                                                  if (u->name == name)
                                                      return true;

                                              for (auto& s : getSubModules())
                                                  if (s->name == name)
                                                      return true;

                                              for (auto& a : getProcessorAliases())
                                                  if (a->name == name)
                                                      return true;

                                              for (auto& p : getProcessorInstances())
                                                  if (p->instanceName->toString() == name)
                                                      return true;

                                              return false;
                                          });
        }